

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

long GetStreamReadAvailable(PaStream *s)

{
  int local_34;
  unsigned_long uStack_30;
  int xrun;
  unsigned_long avail;
  PaAlsaStream *stream;
  PaStream *pPStack_18;
  PaError result;
  PaStream *s_local;
  
  stream._4_4_ = 0;
  avail = (unsigned_long)s;
  pPStack_18 = s;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)((long)s + 0x288),&stack0xffffffffffffffd0,
                          &local_34);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4495\n"
                     );
    stream._4_4_ = paUtilErr_;
  }
  else {
    if (local_34 == 0) {
      return uStack_30;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)avail);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4498\n"
                       );
      stream._4_4_ = paUtilErr_;
    }
    else {
      paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                             ((PaAlsaStreamComponent *)(avail + 0x288),&stack0xffffffffffffffd0,
                              &local_34);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4499\n"
                         );
        stream._4_4_ = paUtilErr_;
      }
      else {
        if (local_34 == 0) {
          return uStack_30;
        }
        paUtilErr_ = -0x26fd;
        PaUtil_DebugPrint(
                         "Expression \'paInputOverflowed\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4501\n"
                         );
        stream._4_4_ = paUtilErr_;
      }
    }
  }
  paUtilErr_ = stream._4_4_;
  return (long)stream._4_4_;
}

Assistant:

static signed long GetStreamReadAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun ) );
    if( xrun )
    {
        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun ) );
        if( xrun )
            PA_ENSURE( paInputOverflowed );
    }

    return (signed long)avail;

error:
    return result;
}